

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O0

void __thiscall
FZipExploder::InsertCode
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          uint pos,int bits,unsigned_short code,int len,uchar value)

{
  byte bVar1;
  HuffNode *pHVar2;
  byte bVar3;
  int local_34;
  uint local_30;
  int i;
  uint child;
  uint node;
  int len_local;
  unsigned_short code_local;
  int bits_local;
  uint pos_local;
  TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder_local;
  FZipExploder *this_local;
  
  if (len < 1) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                  ,0x60,
                  "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                 );
  }
  bVar3 = (byte)bits;
  i = pos + ((uint)code & (1 << (bVar3 & 0x1f)) - 1U);
  if (bits < len) {
    pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                       (decoder,(ulong)(uint)i);
    local_30 = (uint)pHVar2->ChildTable;
    if (local_30 == 0) {
      local_30 = InitTable(this,decoder,0x10);
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      pHVar2->ChildTable = (unsigned_short)local_30;
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      pHVar2->Length = bVar3;
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      pHVar2->Value = '\0';
    }
    else {
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      if ((uint)pHVar2->Length != bits) {
        __assert_fail("decoder[node].Length == bits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                      ,0x70,
                      "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                     );
      }
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      if (pHVar2->Value != '\0') {
        __assert_fail("decoder[node].Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                      ,0x71,
                      "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                     );
      }
    }
    InsertCode(this,decoder,local_30,4,(unsigned_short)((int)(uint)code >> (bVar3 & 0x1f)),
               len - bits,value);
  }
  else {
    bVar1 = (byte)len;
    local_34 = 1 << (bVar3 - bVar1 & 0x1f);
    while (local_34 = local_34 + -1, -1 < local_34) {
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      pHVar2->Length = bVar1;
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      pHVar2->Value = value;
      pHVar2 = TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::operator[]
                         (decoder,(ulong)(uint)i);
      if (pHVar2->ChildTable != 0) {
        __assert_fail("decoder[node].ChildTable == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                      ,0x7d,
                      "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                     );
      }
      i = (1 << (bVar1 & 0x1f)) + i;
    }
  }
  return;
}

Assistant:

void FZipExploder::InsertCode(TArray<HuffNode> &decoder, unsigned int pos, int bits, unsigned short code, int len, unsigned char value)
{
	assert(len > 0);
	unsigned int node = pos + (code & ((1 << bits) - 1));

	if (len > bits)
	{ // This code uses more bits than this level has room for. Store the bottom bits
	  // in this table, then proceed to the next one.
		unsigned int child = decoder[node].ChildTable;
		if (child == 0)
		{ // Need to create child table.
			child = InitTable(decoder, 1 << REST_BIT_LEN);
			decoder[node].ChildTable = child;
			decoder[node].Length = bits;
			decoder[node].Value = 0;
		}
		else
		{
			assert(decoder[node].Length == bits);
			assert(decoder[node].Value == 0);
		}
		InsertCode(decoder, child, REST_BIT_LEN, code >> bits, len - bits, value);
	}
	else
	{ // If this code uses fewer bits than this level of the table, it is
	  // inserted repeatedly for each value that matches it at its lower
	  // bits.
		for (int i = 1 << (bits - len); --i >= 0; node += 1 << len)
		{
			decoder[node].Length = len;
			decoder[node].Value = value;
			assert(decoder[node].ChildTable == 0);
		}
	}
}